

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

string * __thiscall
Catch::StringMaker<char*,void>::convert_abi_cxx11_
          (string *__return_storage_ptr__,StringMaker<char*,void> *this,char *str)

{
  undefined1 uVar1;
  size_t sVar2;
  undefined1 in_R8B;
  StringRef string;
  
  if (this == (StringMaker<char*,void> *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,"{null string}","");
  }
  else {
    sVar2 = strlen((char *)this);
    uVar1 = (**(code **)(*(long *)*Context::currentContext + 0x50))();
    string.m_size._0_1_ = uVar1;
    string.m_start = (char *)sVar2;
    string.m_size._1_7_ = 0;
    Detail::convertIntoString_abi_cxx11_(__return_storage_ptr__,(Detail *)this,string,(bool)in_R8B);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StringMaker<char*>::convert(char* str) { // NOLINT(readability-non-const-parameter)
    if (str) {
        return Detail::convertIntoString( str );
    } else {
        return{ "{null string}" };
    }
}